

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_messaging_ll.c
# Opt level: O0

int addPropertiesToAMQPMessage
              (IOTHUB_MESSAGE_HANDLE iothub_message_handle,MESSAGE_HANDLE uamqp_message,
              AMQP_VALUE to_amqp_value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l_5;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  PROPERTIES_HANDLE pPStack_30;
  int api_call_result;
  PROPERTIES_HANDLE uamqp_message_properties;
  AMQP_VALUE pAStack_20;
  int result;
  AMQP_VALUE to_amqp_value_local;
  MESSAGE_HANDLE uamqp_message_local;
  IOTHUB_MESSAGE_HANDLE iothub_message_handle_local;
  
  pPStack_30 = (PROPERTIES_HANDLE)0x0;
  pAStack_20 = to_amqp_value;
  to_amqp_value_local = (AMQP_VALUE)uamqp_message;
  uamqp_message_local = (MESSAGE_HANDLE)iothub_message_handle;
  iVar1 = message_get_properties(uamqp_message,&stack0xffffffffffffffd0);
  if (iVar1 == 0) {
    if ((pPStack_30 == (PROPERTIES_HANDLE)0x0) &&
       (pPStack_30 = properties_create(), pPStack_30 == (PROPERTIES_HANDLE)0x0)) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                  ,"addPropertiesToAMQPMessage",0x120,1,
                  "Failed to create properties map for uAMQP message (error code %d).",0);
      }
      uamqp_message_properties._4_4_ = 0x121;
    }
    else {
      iVar1 = setMessageId((IOTHUB_MESSAGE_HANDLE)uamqp_message_local,pPStack_30);
      if (iVar1 == 0) {
        iVar1 = setCorrelationId((IOTHUB_MESSAGE_HANDLE)uamqp_message_local,pPStack_30);
        if (iVar1 == 0) {
          iVar1 = properties_set_to(pPStack_30,pAStack_20);
          if (iVar1 == 0) {
            iVar1 = message_set_properties((MESSAGE_HANDLE)to_amqp_value_local,pPStack_30);
            if (iVar1 == 0) {
              uamqp_message_properties._4_4_ = 0;
            }
            else {
              p_Var2 = xlogging_get_log_function();
              if (p_Var2 != (LOGGER_LOG)0x0) {
                (*p_Var2)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                          ,"addPropertiesToAMQPMessage",0x138,1,
                          "Failed to set properties map on uAMQP message (error code %d).",iVar1);
              }
              uamqp_message_properties._4_4_ = 0x139;
            }
          }
          else {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                        ,"addPropertiesToAMQPMessage",0x133,1,
                        "Could not create properties for message - properties_set_to failed");
            }
            uamqp_message_properties._4_4_ = 0x134;
          }
        }
        else {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                      ,"addPropertiesToAMQPMessage",300,1,"Failed to set uampq correlationId.");
          }
          uamqp_message_properties._4_4_ = 0x12d;
        }
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                    ,"addPropertiesToAMQPMessage",0x127,1,"Failed to set uampq messageId.");
        }
        uamqp_message_properties._4_4_ = 0x128;
      }
      properties_destroy(pPStack_30);
    }
  }
  else {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_messaging_ll.c"
                ,"addPropertiesToAMQPMessage",0x11a,1,
                "Failed to get properties map from uAMQP message (error code %d).",iVar1);
    }
    uamqp_message_properties._4_4_ = 0x11b;
  }
  return uamqp_message_properties._4_4_;
}

Assistant:

static int addPropertiesToAMQPMessage(IOTHUB_MESSAGE_HANDLE iothub_message_handle, MESSAGE_HANDLE uamqp_message, AMQP_VALUE to_amqp_value)
{
    int result;
    PROPERTIES_HANDLE uamqp_message_properties = NULL; /* This initialization is forced by Valgrind */
    int api_call_result;

    if ((api_call_result = message_get_properties(uamqp_message, &uamqp_message_properties)) != 0)
    {
        LogError("Failed to get properties map from uAMQP message (error code %d).", api_call_result);
        result = MU_FAILURE;
    }
    else if (uamqp_message_properties == NULL &&
        (uamqp_message_properties = properties_create()) == NULL)
    {
        LogError("Failed to create properties map for uAMQP message (error code %d).", api_call_result);
        result = MU_FAILURE;
    }
    else
    {
        if (setMessageId(iothub_message_handle, uamqp_message_properties) != 0)
        {
            LogError("Failed to set uampq messageId.");
            result = MU_FAILURE;
        }
        else if (setCorrelationId(iothub_message_handle, uamqp_message_properties) != 0)
        {
            LogError("Failed to set uampq correlationId.");
            result = MU_FAILURE;
        }
        else
        {
            if ((properties_set_to(uamqp_message_properties, to_amqp_value)) != 0)
            {
                LogError("Could not create properties for message - properties_set_to failed");
                result = MU_FAILURE;
            }
            else if ((api_call_result = message_set_properties(uamqp_message, uamqp_message_properties)) != 0)
            {
                LogError("Failed to set properties map on uAMQP message (error code %d).", api_call_result);
                result = MU_FAILURE;
            }
            else
            {
                result = 0;
            }
        }
        properties_destroy(uamqp_message_properties);
    }
    return result;
}